

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_image.c
# Opt level: O0

void aom_img_free(aom_image_t *img)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    aom_img_remove_metadata((aom_image_t *)0x19fd55);
    if ((*(long *)((long)in_RDI + 0x88) != 0) && (*(int *)((long)in_RDI + 0x90) != 0)) {
      aom_free(img);
    }
    if (*(int *)((long)in_RDI + 0x94) != 0) {
      free(in_RDI);
    }
  }
  return;
}

Assistant:

void aom_img_free(aom_image_t *img) {
  if (img) {
    aom_img_remove_metadata(img);
    if (img->img_data && img->img_data_owner) aom_free(img->img_data);

    if (img->self_allocd) free(img);
  }
}